

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGeneric.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintTwoGeneric::ChConstraintTwoGeneric
          (ChConstraintTwoGeneric *this,ChConstraintTwoGeneric *other)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Index index;
  ulong uVar12;
  Index index_1;
  double *pdVar13;
  char *__function;
  long lVar14;
  Index size;
  ActualDstType actualDst_2;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  
  ChConstraintTwo::ChConstraintTwo(&this->super_ChConstraintTwo,&other->super_ChConstraintTwo);
  (this->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b3ae50;
  (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = 0;
  (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = 0;
  (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  pdVar3 = (other->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
           m_data;
  uVar4 = (other->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
          m_cols;
  if (uVar4 == 0) {
    uVar12 = 0;
    pdVar13 = (double *)0x0;
LAB_007d5314:
    if ((long)uVar12 < (long)uVar4) {
      do {
        pdVar13[uVar12] = pdVar3[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar4 != uVar12);
    }
    pdVar3 = (other->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
    uVar4 = (other->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols;
    if (((this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
         m_cols == uVar4) ||
       (Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
                  (&(this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,1,
                   uVar4),
       (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols
       == uVar4)) {
      uVar12 = uVar4 + 7;
      if (-1 < (long)uVar4) {
        uVar12 = uVar4;
      }
      uVar12 = uVar12 & 0xfffffffffffffff8;
      pdVar13 = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                m_storage.m_data;
      if (7 < (long)uVar4) {
        lVar14 = 0;
        do {
          pdVar1 = pdVar3 + lVar14;
          dVar5 = pdVar1[1];
          dVar6 = pdVar1[2];
          dVar7 = pdVar1[3];
          dVar8 = pdVar1[4];
          dVar9 = pdVar1[5];
          dVar10 = pdVar1[6];
          dVar11 = pdVar1[7];
          pdVar2 = pdVar13 + lVar14;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar5;
          pdVar2[2] = dVar6;
          pdVar2[3] = dVar7;
          pdVar2[4] = dVar8;
          pdVar2[5] = dVar9;
          pdVar2[6] = dVar10;
          pdVar2[7] = dVar11;
          lVar14 = lVar14 + 8;
        } while (lVar14 < (long)uVar12);
      }
      if ((long)uVar12 < (long)uVar4) {
        do {
          pdVar13[uVar12] = pdVar3[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
      }
      pdVar3 = (other->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar4 = (other->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows;
      if (((this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows == uVar4) ||
         (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&(this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     uVar4,1),
         (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows == uVar4)) {
        pdVar13 = (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        uVar12 = uVar4 + 7;
        if (-1 < (long)uVar4) {
          uVar12 = uVar4;
        }
        uVar12 = uVar12 & 0xfffffffffffffff8;
        if (7 < (long)uVar4) {
          lVar14 = 0;
          do {
            pdVar1 = pdVar3 + lVar14;
            dVar5 = pdVar1[1];
            dVar6 = pdVar1[2];
            dVar7 = pdVar1[3];
            dVar8 = pdVar1[4];
            dVar9 = pdVar1[5];
            dVar10 = pdVar1[6];
            dVar11 = pdVar1[7];
            pdVar2 = pdVar13 + lVar14;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar5;
            pdVar2[2] = dVar6;
            pdVar2[3] = dVar7;
            pdVar2[4] = dVar8;
            pdVar2[5] = dVar9;
            pdVar2[6] = dVar10;
            pdVar2[7] = dVar11;
            lVar14 = lVar14 + 8;
          } while (lVar14 < (long)uVar12);
        }
        if ((long)uVar12 < (long)uVar4) {
          do {
            pdVar13[uVar12] = pdVar3[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar4 != uVar12);
        }
        pdVar3 = (other->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar4 = (other->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if (((this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows == uVar4) ||
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&(this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       uVar4,1),
           (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows == uVar4)) {
          pdVar13 = (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          uVar12 = uVar4 + 7;
          if (-1 < (long)uVar4) {
            uVar12 = uVar4;
          }
          uVar12 = uVar12 & 0xfffffffffffffff8;
          if (7 < (long)uVar4) {
            lVar14 = 0;
            do {
              pdVar1 = pdVar3 + lVar14;
              dVar5 = pdVar1[1];
              dVar6 = pdVar1[2];
              dVar7 = pdVar1[3];
              dVar8 = pdVar1[4];
              dVar9 = pdVar1[5];
              dVar10 = pdVar1[6];
              dVar11 = pdVar1[7];
              pdVar2 = pdVar13 + lVar14;
              *pdVar2 = *pdVar1;
              pdVar2[1] = dVar5;
              pdVar2[2] = dVar6;
              pdVar2[3] = dVar7;
              pdVar2[4] = dVar8;
              pdVar2[5] = dVar9;
              pdVar2[6] = dVar10;
              pdVar2[7] = dVar11;
              lVar14 = lVar14 + 8;
            } while (lVar14 < (long)uVar12);
          }
          if ((long)uVar12 < (long)uVar4) {
            do {
              pdVar13[uVar12] = pdVar3[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar4 != uVar12);
          }
          return;
        }
      }
      __function = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
      goto LAB_007d54e5;
    }
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              (&(this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,1,uVar4)
    ;
    if ((this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols
        == uVar4) {
      pdVar13 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                m_storage.m_data;
      uVar12 = uVar4 + 7;
      if (-1 < (long)uVar4) {
        uVar12 = uVar4;
      }
      uVar12 = uVar12 & 0xfffffffffffffff8;
      if (7 < (long)uVar4) {
        lVar14 = 0;
        do {
          pdVar1 = pdVar3 + lVar14;
          dVar5 = pdVar1[1];
          dVar6 = pdVar1[2];
          dVar7 = pdVar1[3];
          dVar8 = pdVar1[4];
          dVar9 = pdVar1[5];
          dVar10 = pdVar1[6];
          dVar11 = pdVar1[7];
          pdVar2 = pdVar13 + lVar14;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar5;
          pdVar2[2] = dVar6;
          pdVar2[3] = dVar7;
          pdVar2[4] = dVar8;
          pdVar2[5] = dVar9;
          pdVar2[6] = dVar10;
          pdVar2[7] = dVar11;
          lVar14 = lVar14 + 8;
        } while (lVar14 < (long)uVar12);
      }
      goto LAB_007d5314;
    }
  }
  __function = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, 1, -1>, SrcXprType = Eigen::Matrix<double, 1, -1>, T1 = double, T2 = double]"
  ;
LAB_007d54e5:
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,__function);
}

Assistant:

ChConstraintTwoGeneric::ChConstraintTwoGeneric(const ChConstraintTwoGeneric& other) : ChConstraintTwo(other) {
    Cq_a = other.Cq_a;
    Cq_b = other.Cq_b;
    Eq_a = other.Eq_a;
    Eq_b = other.Eq_b;
}